

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O3

Vec_Wec_t * Gia_ManFindCofs(Gia_Man_t *p,Vec_Int_t *vRes,Gia_Man_t **ppNew)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  int *piVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  Vec_Wec_t *pVVar9;
  Vec_Int_t *pVVar10;
  Gia_Man_t *p_00;
  size_t sVar11;
  char *pcVar12;
  Vec_Int_t *pVVar13;
  Gia_Obj_t *pGVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  
  iVar8 = vRes->nSize;
  uVar20 = 1 << ((byte)iVar8 & 0x1f);
  pVVar9 = (Vec_Wec_t *)malloc(0x10);
  uVar6 = 8;
  if (8 < uVar20) {
    uVar6 = uVar20;
  }
  pVVar9->nCap = uVar6;
  pVVar10 = (Vec_Int_t *)calloc((long)(int)uVar6,0x10);
  pVVar9->pArray = pVVar10;
  pVVar9->nSize = uVar20;
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar12 = (char *)0x0;
  }
  else {
    sVar11 = strlen(pcVar2);
    pcVar12 = (char *)malloc(sVar11 + 1);
    strcpy(pcVar12,pcVar2);
  }
  p_00->pName = pcVar12;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar12 = (char *)0x0;
  }
  else {
    sVar11 = strlen(pcVar2);
    pcVar12 = (char *)malloc(sVar11 + 1);
    strcpy(pcVar12,pcVar2);
  }
  p_00->pSpec = pcVar12;
  Gia_ManSetRegNum(p_00,p->nRegs);
  Gia_ManHashAlloc(p_00);
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  pVVar13 = p->vCis;
  if (pVVar13->nSize <= vRes->nSize) {
    __assert_fail("Vec_IntSize(vRes) < Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                  ,0x40f,"Vec_Wec_t *Gia_ManFindCofs(Gia_Man_t *, Vec_Int_t *, Gia_Man_t **)");
  }
  if (0 < pVVar13->nSize) {
    lVar17 = 0;
    do {
      iVar7 = pVVar13->pArray[lVar17];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) {
LAB_00222230:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar14 = Gia_ManAppendObj(p_00);
      uVar15 = *(ulong *)pGVar14;
      *(ulong *)pGVar14 = uVar15 | 0x9fffffff;
      *(ulong *)pGVar14 =
           uVar15 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar4 = p_00->pObjs;
      if ((pGVar14 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar14)) {
LAB_0022228d:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar14 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p_00->pObjs;
      if ((pGVar14 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar14)) goto LAB_0022228d;
      pGVar3[iVar7].Value = (int)((ulong)((long)pGVar14 - (long)pGVar4) >> 2) * 0x55555556;
      lVar17 = lVar17 + 1;
      pVVar13 = p->vCis;
    } while (lVar17 < pVVar13->nSize);
  }
  if (iVar8 != 0x1f) {
    uVar15 = 1;
    if (1 < (int)uVar20) {
      uVar15 = (ulong)uVar20;
    }
    uVar19 = 0;
    do {
      iVar8 = vRes->nSize;
      if ((long)iVar8 < 1) {
        iVar7 = p->nObjs;
        if (0 < iVar7) goto LAB_002220c7;
      }
      else {
        piVar5 = vRes->pArray;
        pVVar13 = p->vCis;
        lVar17 = 0;
        do {
          iVar7 = piVar5[lVar17];
          if (((long)iVar7 < 0) || (pVVar13->nSize <= iVar7)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar1 = pVVar13->pArray[iVar7];
          if (((long)iVar1 < 0) || (iVar7 = p->nObjs, iVar7 <= iVar1)) goto LAB_00222230;
          p->pObjs[iVar1].Value = (uint)(((uint)uVar19 >> ((uint)lVar17 & 0x1f) & 1) != 0);
          lVar17 = lVar17 + 1;
        } while (iVar8 != lVar17);
LAB_002220c7:
        lVar17 = 8;
        lVar18 = 0;
        do {
          pGVar3 = p->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          uVar16 = *(ulong *)((long)pGVar3 + lVar17 + -8);
          if ((uVar16 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar16) {
            uVar6 = *(uint *)((long)pGVar3 +
                             lVar17 + (ulong)(uint)((int)(uVar16 & 0x1fffffff) << 2) * -3);
            if (((int)uVar6 < 0) ||
               (uVar20 = *(uint *)((long)pGVar3 +
                                  lVar17 + (ulong)((uint)(uVar16 >> 0x1e) & 0x7ffffffc) * -3),
               (int)uVar20 < 0)) goto LAB_0022226e;
            iVar8 = Gia_ManHashAnd(p_00,uVar6 ^ (uint)(uVar16 >> 0x1d) & 1,
                                   uVar20 ^ (uint)(uVar16 >> 0x3d) & 1);
            *(int *)(&pGVar3->field_0x0 + lVar17) = iVar8;
            iVar7 = p->nObjs;
          }
          lVar18 = lVar18 + 1;
          lVar17 = lVar17 + 0xc;
        } while (lVar18 < iVar7);
      }
      pVVar13 = p->vCos;
      uVar6 = pVVar13->nSize;
      uVar16 = (ulong)uVar6;
      if (0 < (int)uVar6) {
        lVar17 = 0;
        do {
          uVar6 = (uint)uVar16;
          iVar8 = pVVar13->pArray[lVar17];
          if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_00222230;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar3 = p->pObjs + iVar8;
          uVar20 = (uint)*(undefined8 *)pGVar3;
          uVar6 = pGVar3[-(ulong)(uVar20 & 0x1fffffff)].Value;
          if ((int)uVar6 < 0) {
LAB_0022226e:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          Vec_IntPush(pVVar10 + uVar19,uVar20 >> 0x1d & 1 ^ uVar6);
          lVar17 = lVar17 + 1;
          pVVar13 = p->vCos;
          uVar6 = pVVar13->nSize;
          uVar16 = (ulong)(int)uVar6;
        } while (lVar17 < (long)uVar16);
      }
      if (pVVar10[uVar19].nSize != uVar6) {
        __assert_fail("Vec_IntSize(vLayer) == Gia_ManCoNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                      ,0x41b,"Vec_Wec_t *Gia_ManFindCofs(Gia_Man_t *, Vec_Int_t *, Gia_Man_t **)");
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != uVar15);
  }
  if (ppNew != (Gia_Man_t **)0x0) {
    *ppNew = p_00;
  }
  return pVVar9;
}

Assistant:

Vec_Wec_t * Gia_ManFindCofs( Gia_Man_t * p, Vec_Int_t * vRes, Gia_Man_t ** ppNew )
{
    Gia_Obj_t * pObj;
    Vec_Wec_t * vCofs = Vec_WecStart( 1 << Vec_IntSize(vRes) );
    int Value, i, m, nMints = 1 << Vec_IntSize(vRes);
    Gia_Man_t * pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    Gia_ManHashAlloc( pNew );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    assert( Vec_IntSize(vRes) < Gia_ManCiNum(p) );
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    for ( m = 0; m < nMints; m++ )
    {
        Vec_Int_t * vLayer = Vec_WecEntry( vCofs, m );
        Vec_IntForEachEntry( vRes, Value, i )
            Gia_ManCi(p, Value)->Value = (unsigned)((m >> i) & 1);
        Gia_ManForEachAnd( p, pObj, i )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachCo( p, pObj, i )
            Vec_IntPush( vLayer, Gia_ObjFanin0Copy(pObj) );
        assert( Vec_IntSize(vLayer) == Gia_ManCoNum(p) );
        //printf( "%3d : ", m ); Vec_IntPrint( vLayer );
    }
    if ( ppNew != NULL )
        *ppNew = pNew;
    return vCofs;
}